

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O3

btbb_piconet * btbb_next_survey_result(void)

{
  survey_hash *__ptr;
  btbb_piconet *pbVar1;
  
  __ptr = piconet_survey;
  if (piconet_survey == (survey_hash *)0x0) {
    pbVar1 = (btbb_piconet *)0x0;
  }
  else {
    pbVar1 = piconet_survey->pn;
    piconet_survey = (survey_hash *)(piconet_survey->hh).next;
    free(__ptr);
  }
  return pbVar1;
}

Assistant:

btbb_piconet *btbb_next_survey_result() {
	btbb_piconet *pn = NULL;
	survey_hash *tmp;

	if (piconet_survey != NULL) {
		pn = piconet_survey->pn;
		tmp = piconet_survey;
		piconet_survey = piconet_survey->hh.next;
		free(tmp);
	}
	return pn;
}